

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_strided_acc(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld,
                     void *alpha)

{
  int iVar1;
  Integer IVar2;
  Integer *in_RCX;
  Integer *in_RSI;
  long in_RDI;
  long in_R8;
  Integer *in_R9;
  _iterator_hdl it_hdl;
  int stride_loc [14];
  int stride_rem [14];
  int count [14];
  char *prem;
  char *pbuf;
  Integer phi [7];
  Integer plo [7];
  Integer *bhi;
  Integer *blo;
  Integer idx_buf;
  Integer ldrem [7];
  int ndim;
  int proc;
  int optype;
  int i;
  Integer nproc;
  Integer p_handle;
  Integer type;
  Integer nstride;
  Integer size;
  Integer idx;
  Integer handle;
  Integer np;
  Integer p;
  undefined4 in_stack_fffffffffffffacc;
  void *in_stack_fffffffffffffad0;
  int *in_stack_fffffffffffffad8;
  void *in_stack_fffffffffffffae0;
  void *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf4;
  int *in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb10;
  Integer in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  _iterator_hdl *in_stack_fffffffffffffcb8;
  Integer *in_stack_fffffffffffffcc0;
  Integer *in_stack_fffffffffffffcc8;
  Integer in_stack_fffffffffffffcd0;
  int local_228 [16];
  int local_1e8 [16];
  int local_1a8 [16];
  long local_168;
  long local_160;
  Integer local_158 [8];
  Integer local_118 [7];
  long local_e0;
  Integer *local_d8;
  long local_d0;
  Integer local_c8 [8];
  int local_88;
  int local_84;
  undefined4 local_80;
  int local_7c;
  Integer local_78;
  long local_70;
  long local_68;
  Integer local_60;
  long local_58;
  long local_48;
  undefined8 local_40;
  Integer *local_30;
  long local_28;
  Integer *local_20;
  Integer *local_10;
  
  local_40 = 0;
  local_48 = in_RDI + 1000;
  local_80 = 0xffffffff;
  local_58 = (long)GA[local_48].elemsize;
  local_88 = (int)GA[local_48].ndim;
  local_68 = (long)GA[local_48].type;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_78 = pnga_nnodes();
  local_70 = (long)GA[local_48].p_handle;
  if (local_68 == 0x3ec) {
    local_80 = 0x26;
  }
  else if (local_68 == 0x3eb) {
    local_80 = 0x27;
  }
  else if (local_68 == 0x3ef) {
    local_80 = 0x29;
  }
  else if (local_68 == 0x3ee) {
    local_80 = 0x28;
  }
  else if (local_68 == 0x3e9) {
    local_80 = 0x25;
  }
  else if (local_68 == 0x3ea) {
    local_80 = 0x2a;
  }
  else {
    pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  for (local_7c = 0; local_7c < local_88; local_7c = local_7c + 1) {
    if (local_20[local_7c] < 1) {
      pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
  }
  gai_iterator_init(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                    in_stack_fffffffffffffcb8);
  while (iVar1 = gai_iterator_next((_iterator_hdl *)phi[3],(int *)phi[2],(Integer **)phi[1],
                                   (Integer **)phi[0],(char **)pbuf,(Integer *)prem), iVar1 != 0) {
    for (local_7c = 0; local_7c < local_88; local_7c = local_7c + 1) {
      local_118[local_7c] = local_d8[local_7c];
      local_158[local_7c] = *(Integer *)(local_e0 + (long)local_7c * 8);
    }
    IVar2 = gai_correct_strided_patch((long)local_88,local_10,local_20,local_118,local_158);
    if (IVar2 != 0) {
      gai_FindOffset((long)local_88,local_d8,local_118,local_c8,&local_d0);
      local_168 = local_58 * local_d0 + local_168;
      gai_ComputePatchIndexWithSkip((long)local_88,local_10,local_118,local_20,local_30,&local_d0);
      local_160 = local_58 * local_d0 + local_28;
      iVar1 = gai_ComputeCountWithSkip
                        ((long)local_88,local_118,local_158,local_20,local_1a8,&local_60);
      if (iVar1 != 0) {
        local_1a8[0] = local_1a8[0] * (int)local_58;
        gai_SetStrideWithSkip
                  ((long)local_88,local_58,local_30,local_c8,local_1e8,local_228,local_20);
        if (local_70 != -1) {
          local_84 = PGRP_LIST[local_70].inv_map_proc_list[local_84];
        }
        ARMCI_AccS(in_stack_fffffffffffffaf4,in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                   in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   (int *)CONCAT44(in_stack_fffffffffffffacc,local_84),in_stack_fffffffffffffb00,
                   in_stack_fffffffffffffb08,in_stack_fffffffffffffb10);
      }
    }
  }
  gai_iterator_destroy((_iterator_hdl *)0x206b20);
  return;
}

Assistant:

void pnga_strided_acc(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                      void *buf, Integer *ld, void *alpha)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer
     alpha:  muliplicative scale factor */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, type, p_handle, nproc;
  int i, optype=-1, proc, ndim;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  type = GA[handle].type;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  if (type == C_DBL) optype = ARMCI_ACC_DBL;
  else if (type == C_FLOAT) optype = ARMCI_ACC_FLT;
  else if (type == C_DCPL) optype = ARMCI_ACC_DCP;
  else if (type == C_SCPL) optype = ARMCI_ACC_CPL;
  else if (type == C_INT) optype = ARMCI_ACC_INT;
  else if (type == C_LONG) optype = ARMCI_ACC_LNG;
  else pnga_error("nga_strided_acc: type not supported",type);

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_acc: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, count,
          nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}